

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> * __thiscall
kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
await_resume(OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>
             *__return_storage_ptr__,
            PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
            *this)

{
  OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *pOVar1;
  void *unaff_retaddr;
  OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *value;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this_local;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  pOVar1 = readMaybe<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>
                     (&(this->result).value);
  if (pOVar1 != (OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)0x0) {
    pOVar1 = mv<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>(pOVar1);
    OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>::OneOf
              (__return_storage_ptr__,pOVar1);
    return __return_storage_ptr__;
  }
  inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
             ,0x9d4,"value != nullptr","\"Neither exception nor value present.\"",
             "Neither exception nor value present.");
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }